

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

btScalar __thiscall
btCollisionWorld::objectQuerySingleInternal::BridgeTriangleConvexcastCallback::reportHit
          (BridgeTriangleConvexcastCallback *this,btVector3 *hitNormalLocal,btVector3 *hitPointLocal
          ,btScalar hitFraction,int partId,int triangleIndex)

{
  ConvexResultCallback *pCVar1;
  btScalar extraout_XMM0_Da;
  LocalShapeInfo shapeInfo;
  LocalConvexResult convexResult;
  int local_40;
  int local_3c;
  btCollisionObject *local_38;
  int *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  btScalar local_18;
  btScalar bStack_14;
  btScalar bStack_10;
  btScalar bStack_c;
  btScalar local_8;
  
  pCVar1 = this->m_resultCallback;
  if (hitFraction <= pCVar1->m_closestHitFraction) {
    local_38 = this->m_collisionObject;
    local_30 = &local_40;
    local_28 = *(undefined8 *)hitNormalLocal->m_floats;
    uStack_20 = *(undefined8 *)(hitNormalLocal->m_floats + 2);
    local_18 = hitPointLocal->m_floats[0];
    bStack_14 = hitPointLocal->m_floats[1];
    bStack_10 = hitPointLocal->m_floats[2];
    bStack_c = hitPointLocal->m_floats[3];
    local_40 = partId;
    local_3c = triangleIndex;
    local_8 = hitFraction;
    (*pCVar1->_vptr_ConvexResultCallback[3])(pCVar1,&local_38,1);
    hitFraction = extraout_XMM0_Da;
  }
  return hitFraction;
}

Assistant:

virtual btScalar reportHit(const btVector3& hitNormalLocal, const btVector3& hitPointLocal, btScalar hitFraction, int partId, int triangleIndex )
					{
						btCollisionWorld::LocalShapeInfo	shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;
						if (hitFraction <= m_resultCallback->m_closestHitFraction)
						{

							btCollisionWorld::LocalConvexResult convexResult
								(m_collisionObject,
								&shapeInfo,
								hitNormalLocal,
								hitPointLocal,
								hitFraction);

							bool	normalInWorldSpace = true;


							return m_resultCallback->addSingleResult(convexResult,normalInWorldSpace);
						}
						return hitFraction;
					}